

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

MSize var_lookup_(FuncState *fs,GCstr *name,ExpDesc *e,int first)

{
  byte bVar1;
  uint uVar2;
  MSize MVar3;
  FuncScope *pFVar4;
  ulong uVar5;
  MSize MVar6;
  ulong uVar7;
  uint uVar8;
  
  if (fs == (FuncState *)0x0) {
    e->k = VGLOBAL;
    e->t = 0xffffffff;
    e->f = 0xffffffff;
    (e->u).sval = name;
LAB_0012e815:
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = fs->nactvar;
    uVar8 = uVar2;
    do {
      uVar8 = uVar8 - 1;
      uVar2 = uVar2 - 1;
      if ((int)uVar2 < 0) {
        MVar3 = var_lookup_(fs->prev,name,e,0);
        if ((int)MVar3 < 0) goto LAB_0012e815;
        bVar1 = fs->nuv;
        uVar2 = (uint)bVar1;
        if (bVar1 == 0) {
          uVar5 = 0;
          goto LAB_0012e81e;
        }
        uVar5 = (ulong)bVar1;
        uVar7 = 0;
        goto LAB_0012e7e7;
      }
    } while ((GCstr *)(ulong)fs->ls->vstack[*(ushort *)((long)fs->varmap + (ulong)(uVar8 * 2))].name
                             .gcptr32 != name);
    e->k = VLOCAL;
    e->t = 0xffffffff;
    (e->u).s.info = uVar2;
    e->f = 0xffffffff;
    if (first == 0) {
      pFVar4 = (FuncScope *)&fs->bl;
      do {
        pFVar4 = pFVar4->prev;
        if (pFVar4 == (FuncScope *)0x0) goto LAB_0012e7a0;
      } while (uVar2 < pFVar4->nactvar);
      pFVar4->flags = pFVar4->flags | 8;
    }
LAB_0012e7a0:
    uVar2 = (uint)fs->varmap[uVar8 & 0x7fffffff];
    *(uint *)((long)&e->u + 4) = (uint)fs->varmap[uVar8 & 0x7fffffff];
  }
  return uVar2;
  while (uVar7 = uVar7 + 1, uVar5 != uVar7) {
LAB_0012e7e7:
    if (MVar3 == fs->uvmap[uVar7]) {
      uVar2 = (uint)uVar7;
      goto LAB_0012e848;
    }
  }
  if (0x3b < bVar1) {
    err_limit(fs,0x3c,"upvalues");
  }
LAB_0012e81e:
  fs->uvmap[uVar5] = (VarIndex)MVar3;
  MVar6 = MVar3;
  if (e->k != VLOCAL) {
    MVar6 = (e->u).s.info - 0x3c;
  }
  fs->uvtmp[uVar5] = (VarIndex)MVar6;
  fs->nuv = bVar1 + 1;
LAB_0012e848:
  (e->u).s.info = uVar2 & 0xff;
  e->k = VUPVAL;
  return MVar3;
}

Assistant:

static MSize var_lookup_(FuncState *fs, GCstr *name, ExpDesc *e, int first)
{
  if (fs) {
    BCReg reg = var_lookup_local(fs, name);
    if ((int32_t)reg >= 0) {  /* Local in this function? */
      expr_init(e, VLOCAL, reg);
      if (!first)
	fscope_uvmark(fs, reg);  /* Scope now has an upvalue. */
      return (MSize)(e->u.s.aux = (uint32_t)fs->varmap[reg]);
    } else {
      MSize vidx = var_lookup_(fs->prev, name, e, 0);  /* Var in outer func? */
      if ((int32_t)vidx >= 0) {  /* Yes, make it an upvalue here. */
	e->u.s.info = (uint8_t)var_lookup_uv(fs, vidx, e);
	e->k = VUPVAL;
	return vidx;
      }
    }
  } else {  /* Not found in any function, must be a global. */
    expr_init(e, VGLOBAL, 0);
    e->u.sval = name;
  }
  return (MSize)-1;  /* Global. */
}